

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void lj_state_free(global_State *g,lua_State *L)

{
  uint32_t uVar1;
  size_t sVar2;
  
  lj_func_closeuv(L,(TValue *)(ulong)(L->stack).ptr32);
  uVar1 = (L->stack).ptr32;
  sVar2 = (ulong)L->stacksize << 3;
  (g->gc).total = (g->gc).total - (int)sVar2;
  (*g->allocf)(g->allocd,(void *)uVar1,sVar2,0);
  (g->gc).total = (g->gc).total - 0x40;
  (*g->allocf)(g->allocd,L,0x40,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_state_free(global_State *g, lua_State *L)
{
  lua_assert(L != mainthread(g));
  lj_func_closeuv(L, tvref(L->stack));
  lua_assert(gcref(L->openupval) == NULL);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
  lj_mem_freet(g, L);
}